

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_prefix_coding.h
# Opt level: O0

bool __thiscall
lzham::prefix_coding::decoder_tables::assign(decoder_tables *this,decoder_tables *rhs)

{
  uint32 *puVar1;
  uint *puVar2;
  unsigned_short *puVar3;
  decoder_tables *in_RSI;
  decoder_tables *in_RDI;
  uint16 *pCur_sorted_symbol_order;
  uint32 *pCur_lookup;
  uint *in_stack_ffffffffffffffc8;
  uint16 *context;
  
  if (in_RDI != in_RSI) {
    if (in_RDI->m_malloc_context != in_RSI->m_malloc_context) {
      clear(in_RDI);
      in_RDI->m_malloc_context = in_RSI->m_malloc_context;
    }
    puVar1 = in_RDI->m_lookup;
    context = in_RDI->m_sorted_symbol_order;
    memcpy(in_RDI,in_RSI,200);
    if ((((puVar1 == (uint32 *)0x0) || (context == (uint16 *)0x0)) ||
        (in_RSI->m_cur_lookup_size != in_RDI->m_cur_lookup_size)) ||
       (in_RSI->m_cur_sorted_symbol_order_size != in_RDI->m_cur_sorted_symbol_order_size)) {
      lzham_delete_array<unsigned_int>(in_RDI,in_stack_ffffffffffffffc8);
      in_RDI->m_lookup = (uint32 *)0x0;
      if (in_RSI->m_lookup != (uint32 *)0x0) {
        puVar2 = lzham_new_array<unsigned_int>(context,(uint32)((ulong)in_RDI >> 0x20));
        in_RDI->m_lookup = puVar2;
        if (in_RDI->m_lookup == (uint32 *)0x0) {
          return false;
        }
        memcpy(in_RDI->m_lookup,in_RSI->m_lookup,(ulong)in_RDI->m_cur_lookup_size << 2);
      }
      lzham_delete_array<unsigned_short>(in_RDI,(unsigned_short *)in_stack_ffffffffffffffc8);
      in_RDI->m_sorted_symbol_order = (uint16 *)0x0;
      if (in_RSI->m_sorted_symbol_order != (uint16 *)0x0) {
        puVar3 = lzham_new_array<unsigned_short>(context,(uint32)((ulong)in_RDI >> 0x20));
        in_RDI->m_sorted_symbol_order = puVar3;
        if (in_RDI->m_sorted_symbol_order == (uint16 *)0x0) {
          return false;
        }
        memcpy(in_RDI->m_sorted_symbol_order,in_RSI->m_sorted_symbol_order,
               (ulong)in_RDI->m_cur_sorted_symbol_order_size << 1);
      }
    }
    else {
      in_RDI->m_lookup = puVar1;
      in_RDI->m_sorted_symbol_order = context;
      memcpy(in_RDI->m_lookup,in_RSI->m_lookup,(ulong)in_RDI->m_cur_lookup_size << 2);
      memcpy(in_RDI->m_sorted_symbol_order,in_RSI->m_sorted_symbol_order,
             (ulong)in_RDI->m_cur_sorted_symbol_order_size << 1);
    }
  }
  return true;
}

Assistant:

inline bool assign(const decoder_tables& rhs)
         {
            if (this == &rhs)
               return true;

            if (m_malloc_context != rhs.m_malloc_context)
            {
               clear();

               m_malloc_context = rhs.m_malloc_context;
            }

            uint32* pCur_lookup = m_lookup;
            uint16* pCur_sorted_symbol_order = m_sorted_symbol_order;

            memcpy(this, &rhs, sizeof(*this));

            if ((pCur_lookup) && (pCur_sorted_symbol_order) && (rhs.m_cur_lookup_size == m_cur_lookup_size) && (rhs.m_cur_sorted_symbol_order_size == m_cur_sorted_symbol_order_size))
            {
               m_lookup = pCur_lookup;
               m_sorted_symbol_order = pCur_sorted_symbol_order;

               memcpy(m_lookup, rhs.m_lookup, sizeof(m_lookup[0]) * m_cur_lookup_size);
               memcpy(m_sorted_symbol_order, rhs.m_sorted_symbol_order, sizeof(m_sorted_symbol_order[0]) * m_cur_sorted_symbol_order_size);
            }
            else
            {
               lzham_delete_array(m_malloc_context, pCur_lookup);
               m_lookup = NULL;

               if (rhs.m_lookup)
               {
                  m_lookup = lzham_new_array<uint32>(m_malloc_context, m_cur_lookup_size);
                  if (!m_lookup)
                     return false;
                  memcpy(m_lookup, rhs.m_lookup, sizeof(m_lookup[0]) * m_cur_lookup_size);
               }

               lzham_delete_array(m_malloc_context, pCur_sorted_symbol_order);
               m_sorted_symbol_order = NULL;

               if (rhs.m_sorted_symbol_order)
               {
                  m_sorted_symbol_order = lzham_new_array<uint16>(m_malloc_context, m_cur_sorted_symbol_order_size);
                  if (!m_sorted_symbol_order)
                     return false;
                  memcpy(m_sorted_symbol_order, rhs.m_sorted_symbol_order, sizeof(m_sorted_symbol_order[0]) * m_cur_sorted_symbol_order_size);
               }
            }

            return true;
         }